

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O0

void __thiscall helics::apps::Probe::Probe(Probe *this,int argc,char **argv)

{
  Endpoint *in_RDI;
  char **in_stack_000001d0;
  int in_stack_000001dc;
  App *in_stack_000001e0;
  undefined1 in_stack_000001e8 [16];
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  App::App(in_stack_000001e0,(string_view)in_stack_000001e8,in_stack_000001dc,in_stack_000001d0);
  (in_RDI->super_Interface)._vptr_Interface = (_func_int **)&PTR__Probe_00a47720;
  Endpoint::Endpoint(in_RDI);
  *(undefined4 *)&in_RDI[2].super_Interface.mName.field_2 = 0;
  *(undefined4 *)((long)&in_RDI[2].super_Interface.mName.field_2 + 4) = 0;
  return;
}

Assistant:

Probe::Probe(int argc, char* argv[]): App("probe_${#}", argc, argv) {}